

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::objectivec::ObjectiveCGenerator::GenerateAll
          (ObjectiveCGenerator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *context,string *error)

{
  FileDescriptor *file;
  bool bVar1;
  int iVar2;
  string *psVar3;
  pointer ppFVar4;
  ZeroCopyOutputStream *pZVar5;
  undefined4 extraout_var_00;
  FileDescriptor *file_00;
  long lVar6;
  ulong uVar7;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string filepath;
  Options generation_options;
  Printer printer;
  FileGenerator file_generator;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  string *local_210;
  string local_208;
  undefined1 local_1e8 [32];
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  char **local_188 [2];
  char *local_178 [15];
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [12];
  undefined4 extraout_var;
  
  local_210 = error;
  Options::Options((Options *)local_1e8);
  local_228.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&local_228);
  if (local_228.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_228.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      iVar2 = std::__cxx11::string::compare
                        ((char *)((long)&((local_228.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first).
                                         _M_dataplus._M_p + lVar6));
      if (iVar2 == 0) {
        psVar3 = (string *)local_1e8;
      }
      else {
        iVar2 = std::__cxx11::string::compare
                          ((char *)((long)&((local_228.
                                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->first).
                                           _M_dataplus._M_p + lVar6));
        if (iVar2 == 0) {
          psVar3 = (string *)&local_1c8;
        }
        else {
          iVar2 = std::__cxx11::string::compare
                            ((char *)((long)&((local_228.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             _M_dataplus._M_p + lVar6));
          if (iVar2 != 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,"error: Unknown generator option: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((local_228.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                   _M_p + lVar6));
            std::__cxx11::string::operator=((string *)local_210,(string *)local_100);
            if ((FileDescriptor *)local_100._0_8_ != (FileDescriptor *)(local_100 + 0x10)) {
              operator_delete((void *)local_100._0_8_,local_f0[0]._M_allocated_capacity + 1);
            }
            goto LAB_0022ec10;
          }
          psVar3 = (string *)&local_1a8;
        }
      }
      std::__cxx11::string::_M_assign(psVar3);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x40;
    } while (uVar7 < (ulong)((long)local_228.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_228.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  bVar1 = ValidateObjCClassPrefixes(files,(Options *)local_1e8,local_210);
  if (bVar1) {
    ppFVar4 = (files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    bVar1 = true;
    if ((files->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppFVar4) {
      uVar7 = 0;
      do {
        file = ppFVar4[uVar7];
        FileGenerator::FileGenerator((FileGenerator *)local_100,file,(Options *)local_1e8);
        FilePath_abi_cxx11_(&local_208,(objectivec *)file,file_00);
        local_188[0] = local_178;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_188,local_208._M_dataplus._M_p,
                   local_208._M_dataplus._M_p + local_208._M_string_length);
        std::__cxx11::string::append((char *)local_188);
        iVar2 = (*context->_vptr_GeneratorContext[2])(context,(Printer *)local_188);
        pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
        if (local_188[0] != local_178) {
          operator_delete(local_188[0],(ulong)(local_178[0] + 1));
        }
        io::Printer::Printer((Printer *)local_188,pZVar5,'$');
        FileGenerator::GenerateHeader((FileGenerator *)local_100,(Printer *)local_188);
        io::Printer::~Printer((Printer *)local_188);
        if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
        }
        local_188[0] = local_178;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_188,local_208._M_dataplus._M_p,
                   local_208._M_dataplus._M_p + local_208._M_string_length);
        std::__cxx11::string::append((char *)local_188);
        iVar2 = (*context->_vptr_GeneratorContext[2])(context,(Printer *)local_188);
        pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar2);
        if (local_188[0] != local_178) {
          operator_delete(local_188[0],(ulong)(local_178[0] + 1));
        }
        io::Printer::Printer((Printer *)local_188,pZVar5,'$');
        FileGenerator::GenerateSource((FileGenerator *)local_100,(Printer *)local_188);
        io::Printer::~Printer((Printer *)local_188);
        if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        FileGenerator::~FileGenerator((FileGenerator *)local_100);
        uVar7 = uVar7 + 1;
        ppFVar4 = (files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar7 < (ulong)((long)(files->
                                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >>
                              3));
      bVar1 = true;
    }
  }
  else {
LAB_0022ec10:
    bVar1 = false;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  return bVar1;
}

Assistant:

bool ObjectiveCGenerator::GenerateAll(const vector<const FileDescriptor*>& files,
                                      const string& parameter,
                                      GeneratorContext* context,
                                      string* error) const {
  // -----------------------------------------------------------------
  // Parse generator options. These options are passed to the compiler using the
  // --objc_opt flag. The options are passed as a comma separated list of
  // options along with their values. If the option appears multiple times, only
  // the last value will be considered.
  //
  // e.g. protoc ... --objc_opt=expected_prefixes=file.txt,generate_for_named_framework=MyFramework

  Options generation_options;

  vector<pair<string, string> > options;
  ParseGeneratorParameter(parameter, &options);
  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "expected_prefixes_path") {
      // Path to find a file containing the expected prefixes
      // (objc_class_prefix "PREFIX") for proto packages (package NAME). The
      // generator will then issue warnings/errors if in the proto files being
      // generated the option is not listed/wrong/etc in the file.
      //
      // The format of the file is:
      //   - An entry is a line of "package=prefix".
      //   - Comments start with "#".
      //   - A comment can go on a line after a expected package/prefix pair.
      //     (i.e. - "package=prefix # comment")
      //
      // There is no validation that the prefixes are good prefixes, it is
      // assumed that they are when you create the file.
      generation_options.expected_prefixes_path = options[i].second;
    } else if (options[i].first == "generate_for_named_framework") {
      // The name of the framework that protos are being generated for. This
      // will cause the #import statements to be framework based using this
      // name (i.e. - "#import <NAME/proto.pbobjc.h>).
      //
      // NOTE: If this option is used with
      // named_framework_to_proto_path_mappings_path, then this is effectively
      // the "default" framework name used for everything that wasn't mapped by
      // the mapping file.
      generation_options.generate_for_named_framework = options[i].second;
    } else if (options[i].first == "named_framework_to_proto_path_mappings_path") {
      // Path to find a file containing the list of framework names and proto
      // files. The generator uses this to decide if a proto file
      // referenced should use a framework style import vs. a user level import
      // (#import <FRAMEWORK/file.pbobjc.h> vs #import "dir/file.pbobjc.h").
      //
      // The format of the file is:
      //   - An entry is a line of "frameworkName: file.proto, dir/file2.proto".
      //   - Comments start with "#".
      //   - A comment can go on a line after a expected package/prefix pair.
      //     (i.e. - "frameworkName: file.proto # comment")
      //
      // Any number of files can be listed for a framework, just separate them
      // with commas.
      //
      // There can be multiple lines listing the same frameworkName incase it
      // has a lot of proto files included in it; having multiple lines makes
      // things easier to read. If a proto file is not configured in the
      // mappings file, it will use the default framework name if one was passed
      // with generate_for_named_framework, or the relative path to it's include
      // path otherwise.
      generation_options.named_framework_to_proto_path_mappings_path = options[i].second;
    } else {
      *error = "error: Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // -----------------------------------------------------------------

  // Validate the objc prefix/package pairings.
  if (!ValidateObjCClassPrefixes(files, generation_options, error)) {
    // *error will have been filled in.
    return false;
  }

  for (int i = 0; i < files.size(); i++) {
    const FileDescriptor* file = files[i];
    FileGenerator file_generator(file, generation_options);
    string filepath = FilePath(file);

    // Generate header.
    {
      scoped_ptr<io::ZeroCopyOutputStream> output(
          context->Open(filepath + ".pbobjc.h"));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateHeader(&printer);
    }

    // Generate m file.
    {
      scoped_ptr<io::ZeroCopyOutputStream> output(
          context->Open(filepath + ".pbobjc.m"));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateSource(&printer);
    }
  }

  return true;
}